

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

vec2F __thiscall
crnlib::dxt_hc::palettize_alpha
          (dxt_hc *this,color_quad_u8 *pixels,uint pixels_count,uint comp_index)

{
  long lVar1;
  vec2F vVar2;
  vec<1U,_float> vVar3;
  ulong uVar4;
  uint size;
  undefined4 in_register_00000014;
  uint in_R8D;
  ulong uVar5;
  vec1F result [2];
  uint8 alpha [64];
  uint weights [64];
  vec1F vectors [64];
  vec<1U,_float> local_280;
  undefined4 uStack_27c;
  byte local_278 [64];
  uint local_238 [64];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_138 [66];
  
  uVar5 = (ulong)comp_index;
  if (comp_index != 0) {
    uVar4 = 0;
    do {
      local_278[uVar4] =
           *(byte *)(CONCAT44(in_register_00000014,pixels_count) + (ulong)in_R8D + uVar4 * 4);
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; comp_index >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<unsigned_char*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_278,local_278 + uVar5,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_char*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_278,local_278 + uVar5);
  }
  if (comp_index == 0) {
    size = 0;
  }
  else {
    uVar4 = 0;
    size = 0;
    do {
      if ((uVar4 == 0) || (local_278[uVar4] != local_278[uVar4 - 1])) {
        local_138[size] = pixels[(ulong)local_278[uVar4] + 0x8d].field_0;
        local_238[size] = 1;
        size = size + 1;
      }
      else {
        local_238[size - 1] = local_238[size - 1] + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  split_vectors<crnlib::vec<1u,float>>
            ((vec<1U,_float> (*) [64])local_138,&local_238,size,(vec<1U,_float> (*) [2])&local_280);
  vVar3.m_s[0] = local_280.m_s[0];
  if (uStack_27c < (float)local_280.m_s[0]) {
    local_280.m_s[0] = (float  [1])(float  [1])uStack_27c;
    uStack_27c = vVar3.m_s[0];
  }
  (this->m_tiles).m_p = (tile_details *)CONCAT44(uStack_27c,local_280.m_s[0]);
  vVar2.m_s[1] = 0.0;
  vVar2.m_s[0] = (float)vVar3.m_s[0];
  return (vec2F)vVar2.m_s;
}

Assistant:

vec2F dxt_hc::palettize_alpha(color_quad_u8* pixels, uint pixels_count, uint comp_index) {
  uint8 alpha[64];
  for (uint p = 0; p < pixels_count; p++)
    alpha[p] = pixels[p][comp_index];
  std::sort(alpha, alpha + pixels_count);
  vec1F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || alpha[i] != alpha[i - 1]) {
      vectors[size][0] = m_uint8_to_float[alpha[i]];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec1F result[2];
  split_vectors<vec1F>(vectors, weights, size, result);
  if (result[0] > result[1])
    utils::swap(result[0], result[1]);
  return *(vec2F*)result;
}